

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewConversion.h
# Opt level: O1

vector<int,_std::allocator<int>_> *
gmlc::utilities::str2vector<int>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,string_view line,int defValue,
          string_view delimiters)

{
  iterator __position;
  size_t sVar1;
  basic_string_view<char,_std::char_traits<char>_> *str;
  pointer pbVar2;
  string_view V;
  string_view sVar3;
  string_viewVector tempVec;
  int local_44;
  string_viewVector local_40;
  
  sVar1 = delimiters._M_len;
  sVar3._M_str = line._M_str;
  sVar3._M_len = (size_t)sVar3._M_str;
  sVar3 = string_viewOps::removeBrackets((string_viewOps *)line._M_len,sVar3);
  string_viewOps::split(&local_40,sVar3,(string_view)delimiters,off);
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CLI::std::vector<int,_std::allocator<int>_>::reserve
            (__return_storage_ptr__,
             (long)local_40.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_40.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  if (local_40.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_40.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar2 = local_40.
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      V._M_str._0_4_ = defValue;
      V._M_len = (size_t)pbVar2->_M_str;
      V._M_str._4_4_ = 0;
      local_44 = numeric_conversion<int>((utilities *)pbVar2->_M_len,V,(int)sVar1);
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        CLI::std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (__return_storage_ptr__,__position,&local_44);
      }
      else {
        *__position._M_current = local_44;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      pbVar2 = pbVar2 + 1;
    } while (pbVar2 != local_40.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_40.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<X> str2vector(
    std::string_view line,
    const X defValue,
    std::string_view delimiters = string_viewOps::default_delim_chars)
{
    line = utilities::string_viewOps::removeBrackets(line);
    auto tempVec = utilities::string_viewOps::split(line, delimiters);
    std::vector<X> av;
    av.reserve(tempVec.size());
    for (const auto& str : tempVec) {
        av.push_back(numeric_conversion<X>(str, defValue));
    }
    return av;
}